

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void wasm::Path::setBinaryenBinDir(string *dir)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  string *dir_local;
  
  std::__cxx11::string::operator=((string *)binDir_abi_cxx11_,(string *)dir);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::back();
    cVar2 = *pcVar4;
    cVar1 = getPathSeparator();
    if (cVar2 == cVar1) {
      return;
    }
  }
  cVar2 = getPathSeparator();
  std::__cxx11::string::operator+=((string *)binDir_abi_cxx11_,cVar2);
  return;
}

Assistant:

void setBinaryenBinDir(const std::string& dir) {
  binDir = dir;
  if (binDir.empty() || binDir.back() != getPathSeparator()) {
    binDir += getPathSeparator();
  }
}